

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O1

cbtScalar __thiscall
cbtCompoundCollisionAlgorithm::calculateTimeOfImpact
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObject *body0,cbtCollisionObject *body1,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  float fVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  cbtScalar cVar12;
  cbtScalar cVar13;
  cbtScalar cVar14;
  cbtScalar cVar15;
  cbtScalar cVar16;
  float fVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  uint uVar25;
  cbtCollisionShape *pcVar26;
  void *pvVar27;
  cbtCollisionAlgorithm *pcVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  long lVar31;
  cbtCollisionObject *pcVar32;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  cbtScalar cVar45;
  
  pcVar32 = body1;
  if (this->m_isSwapped != false) {
    pcVar32 = body0;
    body0 = body1;
  }
  lVar31 = (long)(this->m_childCollisionAlgorithms).m_size;
  if (lVar31 < 1) {
    cVar45 = 1.0;
  }
  else {
    pcVar26 = body0->m_collisionShape;
    cVar45 = 1.0;
    lVar34 = 0x38;
    lVar33 = 0;
    do {
      cVar1 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[0];
      fVar2 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[1];
      cVar3 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[2];
      cVar4 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[3];
      cVar5 = (body0->m_worldTransform).m_basis.m_el[1].m_floats[0];
      cVar6 = (body0->m_worldTransform).m_basis.m_el[1].m_floats[1];
      cVar7 = (body0->m_worldTransform).m_basis.m_el[1].m_floats[2];
      cVar8 = (body0->m_worldTransform).m_basis.m_el[1].m_floats[3];
      cVar9 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[0];
      cVar10 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[1];
      cVar11 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[2];
      cVar12 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[3];
      cVar13 = (body0->m_worldTransform).m_origin.m_floats[0];
      cVar14 = (body0->m_worldTransform).m_origin.m_floats[1];
      cVar15 = (body0->m_worldTransform).m_origin.m_floats[2];
      cVar16 = (body0->m_worldTransform).m_origin.m_floats[3];
      pvVar27 = pcVar26[1].m_userPointer;
      fVar17 = *(float *)((long)pvVar27 + lVar34 + -0x28);
      uVar18 = *(uint *)((long)pvVar27 + lVar34 + -0x38);
      uVar19 = *(uint *)((long)pvVar27 + lVar34 + -0x34);
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar17)),ZEXT416(uVar18),ZEXT416((uint)cVar1)
                               );
      uVar20 = *(uint *)((long)pvVar27 + lVar34 + -0x18);
      auVar44 = vfmadd231ss_fma(auVar35,ZEXT416(uVar20),ZEXT416((uint)cVar3));
      fVar21 = *(float *)((long)pvVar27 + lVar34 + -0x24);
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar21)),ZEXT416(uVar19),ZEXT416((uint)cVar1)
                               );
      uVar22 = *(uint *)((long)pvVar27 + lVar34 + -0x14);
      auVar29 = vfmadd231ss_fma(auVar35,ZEXT416(uVar22),ZEXT416((uint)cVar3));
      uVar23 = *(uint *)((long)pvVar27 + lVar34 + -0x30);
      fVar24 = *(float *)((long)pvVar27 + lVar34 + -0x20);
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar24)),ZEXT416(uVar23),ZEXT416((uint)cVar1)
                               );
      uVar25 = *(uint *)((long)pvVar27 + lVar34 + -0x10);
      auVar30 = vfmadd231ss_fma(auVar35,ZEXT416(uVar25),ZEXT416((uint)cVar3));
      auVar35 = vmulss_avx512f(ZEXT416((uint)cVar6),ZEXT416((uint)fVar17));
      auVar43 = ZEXT416((uint)cVar5);
      auVar35 = vfmadd231ss_fma(auVar35,ZEXT416(uVar18),auVar43);
      auVar36 = vfmadd231ss_avx512f(auVar35,ZEXT416(uVar20),ZEXT416((uint)cVar7));
      auVar35 = vmulss_avx512f(ZEXT416((uint)cVar6),ZEXT416((uint)fVar21));
      auVar35 = vfmadd231ss_fma(auVar35,ZEXT416(uVar19),ZEXT416((uint)cVar5));
      auVar37 = vfmadd231ss_avx512f(auVar35,ZEXT416(uVar22),ZEXT416((uint)cVar7));
      auVar35 = vmulss_avx512f(ZEXT416((uint)cVar6),ZEXT416((uint)fVar24));
      auVar35 = vfmadd231ss_fma(auVar35,ZEXT416(uVar23),auVar43);
      auVar38 = vfmadd231ss_avx512f(auVar35,ZEXT416(uVar25),ZEXT416((uint)cVar7));
      auVar35 = vmulss_avx512f(ZEXT416((uint)cVar10),ZEXT416((uint)fVar17));
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar9),ZEXT416(uVar18));
      auVar39 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar11),ZEXT416(uVar20));
      auVar35 = vmulss_avx512f(ZEXT416((uint)cVar10),ZEXT416((uint)fVar21));
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar9),ZEXT416(uVar19));
      auVar40 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar11),ZEXT416(uVar22));
      auVar35 = vmulss_avx512f(ZEXT416((uint)cVar10),ZEXT416((uint)fVar24));
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar9),ZEXT416(uVar23));
      auVar41 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar11),ZEXT416(uVar25));
      uVar18 = *(uint *)((long)pvVar27 + lVar34 + -8);
      uVar19 = *(uint *)((long)pvVar27 + lVar34 + -4);
      auVar35 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416(uVar19));
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416(uVar18),ZEXT416((uint)cVar1));
      uVar20 = *(uint *)((long)pvVar27 + lVar34);
      auVar42 = vfmadd231ss_avx512f(auVar35,ZEXT416(uVar20),ZEXT416((uint)cVar3));
      auVar35 = vmulss_avx512f(ZEXT416((uint)cVar6),ZEXT416(uVar19));
      auVar35 = vfmadd231ss_fma(auVar35,ZEXT416(uVar18),auVar43);
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416(uVar20),ZEXT416((uint)cVar7));
      auVar43 = vmulss_avx512f(ZEXT416((uint)cVar10),ZEXT416(uVar19));
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)cVar9),ZEXT416(uVar18));
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)cVar11),ZEXT416(uVar20));
      auVar42 = vaddss_avx512f(ZEXT416((uint)cVar13),auVar42);
      auVar35 = vaddss_avx512f(ZEXT416((uint)cVar14),auVar35);
      auVar35 = vinsertps_avx(auVar42,auVar35,0x10);
      auVar42 = vaddss_avx512f(ZEXT416((uint)cVar15),auVar43);
      auVar35 = vinsertps_avx(auVar35,auVar42,0x28);
      body0->m_updateRevision = body0->m_updateRevision + 1;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[0] = auVar44._0_4_;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[1] = auVar29._0_4_;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[2] = auVar30._0_4_;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[3] = 0.0;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[0] = auVar36._0_4_;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[1] = auVar37._0_4_;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[2] = auVar38._0_4_;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[3] = 0.0;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[0] = auVar39._0_4_;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[1] = auVar40._0_4_;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[2] = auVar41._0_4_;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[3] = 0.0;
      *(undefined1 (*) [16])(body0->m_worldTransform).m_origin.m_floats = auVar35;
      pcVar28 = (this->m_childCollisionAlgorithms).m_data[lVar33];
      (*pcVar28->_vptr_cbtCollisionAlgorithm[3])(pcVar28,body0,pcVar32,dispatchInfo,resultOut);
      auVar35 = vminss_avx(auVar44,ZEXT416((uint)cVar45));
      cVar45 = auVar35._0_4_;
      body0->m_updateRevision = body0->m_updateRevision + 1;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[0] = cVar1;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[1] = fVar2;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[2] = cVar3;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[3] = cVar4;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[0] = cVar5;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[1] = cVar6;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[2] = cVar7;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[3] = cVar8;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[0] = cVar9;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[1] = cVar10;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[2] = cVar11;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[3] = cVar12;
      (body0->m_worldTransform).m_origin.m_floats[0] = cVar13;
      (body0->m_worldTransform).m_origin.m_floats[1] = cVar14;
      (body0->m_worldTransform).m_origin.m_floats[2] = cVar15;
      (body0->m_worldTransform).m_origin.m_floats[3] = cVar16;
      lVar33 = lVar33 + 1;
      lVar34 = lVar34 + 0x58;
    } while (lVar31 != lVar33);
  }
  return cVar45;
}

Assistant:

cbtScalar cbtCompoundCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* body0, cbtCollisionObject* body1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	cbtAssert(0);
	//needs to be fixed, using cbtCollisionObjectWrapper and NOT modifying internal data structures
	cbtCollisionObject* colObj = m_isSwapped ? body1 : body0;
	cbtCollisionObject* otherObj = m_isSwapped ? body0 : body1;

	cbtAssert(colObj->getCollisionShape()->isCompound());

	cbtCompoundShape* compoundShape = static_cast<cbtCompoundShape*>(colObj->getCollisionShape());

	//We will use the OptimizedBVH, AABB tree to cull potential child-overlaps
	//If both proxies are Compound, we will deal with that directly, by performing sequential/parallel tree traversals
	//given Proxy0 and Proxy1, if both have a tree, Tree0 and Tree1, this means:
	//determine overlapping nodes of Proxy1 using Proxy0 AABB against Tree1
	//then use each overlapping node AABB against Tree0
	//and vise versa.

	cbtScalar hitFraction = cbtScalar(1.);

	int numChildren = m_childCollisionAlgorithms.size();
	int i;
	cbtTransform orgTrans;
	cbtScalar frac;
	for (i = 0; i < numChildren; i++)
	{
		//cbtCollisionShape* childShape = compoundShape->getChildShape(i);

		//backup
		orgTrans = colObj->getWorldTransform();

		const cbtTransform& childTrans = compoundShape->getChildTransform(i);
		//cbtTransform	newChildWorldTrans = orgTrans*childTrans ;
		colObj->setWorldTransform(orgTrans * childTrans);

		//cbtCollisionShape* tmpShape = colObj->getCollisionShape();
		//colObj->internalSetTemporaryCollisionShape( childShape );
		frac = m_childCollisionAlgorithms[i]->calculateTimeOfImpact(colObj, otherObj, dispatchInfo, resultOut);
		if (frac < hitFraction)
		{
			hitFraction = frac;
		}
		//revert back
		//colObj->internalSetTemporaryCollisionShape( tmpShape);
		colObj->setWorldTransform(orgTrans);
	}
	return hitFraction;
}